

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O3

int amqp_decode_table(amqp_bytes_t encoded,amqp_pool_t *pool,amqp_table_t *output,size_t *offset)

{
  ulong uVar1;
  ulong *puVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  size_t o;
  void *__src;
  void *pvVar7;
  amqp_table_entry_t_ *__dest;
  size_t sVar8;
  int iVar9;
  void *pvVar10;
  ulong uVar11;
  size_t sVar12;
  int local_5c;
  
  pvVar10 = encoded.bytes;
  uVar11 = encoded.len;
  sVar12 = *offset;
  uVar1 = sVar12 + 4;
  *offset = uVar1;
  iVar6 = -2;
  if (uVar1 <= uVar11) {
    uVar4 = *(uint *)((long)pvVar10 + sVar12);
    __src = malloc(0x280);
    if (__src == (void *)0x0) {
      iVar6 = -1;
    }
    else {
      sVar12 = 0;
      local_5c = 0x10;
      iVar9 = 0;
      do {
        uVar5 = *offset;
        if (uVar1 + (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                    ) <= uVar5) {
          output->num_entries = iVar9;
          __dest = (amqp_table_entry_t_ *)amqp_pool_alloc(pool,sVar12);
          output->entries = __dest;
          iVar6 = -1;
          if (__dest != (amqp_table_entry_t_ *)0x0 || iVar9 == 0) {
            memcpy(__dest,__src,sVar12);
            iVar6 = 0;
          }
          break;
        }
        sVar8 = uVar5 + 1;
        *offset = sVar8;
        iVar6 = -2;
        if (uVar11 <= uVar5) break;
        bVar3 = *(byte *)((long)pvVar10 + uVar5);
        if (local_5c <= iVar9) {
          local_5c = local_5c * 2;
          pvVar7 = realloc(__src,(long)local_5c * 0x28);
          if (pvVar7 == (void *)0x0) {
            iVar6 = -1;
            break;
          }
          sVar8 = *offset;
          __src = pvVar7;
        }
        uVar5 = sVar8 + bVar3;
        *offset = uVar5;
        if (uVar11 < uVar5) break;
        puVar2 = (ulong *)((long)__src + sVar12);
        puVar2[1] = sVar8 + (long)pvVar10;
        *puVar2 = (ulong)bVar3;
        iVar6 = amqp_decode_field_value(encoded,pool,(amqp_field_value_t *)(puVar2 + 2),offset);
        iVar9 = iVar9 + 1;
        sVar12 = sVar12 + 0x28;
      } while (-1 < iVar6);
      free(__src);
    }
  }
  return iVar6;
}

Assistant:

int amqp_decode_table(amqp_bytes_t encoded,
                      amqp_pool_t *pool,
                      amqp_table_t *output,
                      size_t *offset)
{
  uint32_t tablesize;
  int num_entries = 0;
  amqp_table_entry_t *entries;
  int allocated_entries = INITIAL_TABLE_SIZE;
  size_t limit;
  int res;

  if (!amqp_decode_32(encoded, offset, &tablesize)) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  entries = malloc(allocated_entries * sizeof(amqp_table_entry_t));
  if (entries == NULL) {
    return AMQP_STATUS_NO_MEMORY;
  }

  limit = *offset + tablesize;
  while (*offset < limit) {
    uint8_t keylen;

    res = AMQP_STATUS_BAD_AMQP_DATA;
    if (!amqp_decode_8(encoded, offset, &keylen)) {
      goto out;
    }

    if (num_entries >= allocated_entries) {
      void *newentries;
      allocated_entries = allocated_entries * 2;
      newentries = realloc(entries, allocated_entries * sizeof(amqp_table_entry_t));
      res = AMQP_STATUS_NO_MEMORY;
      if (newentries == NULL) {
        goto out;
      }

      entries = newentries;
    }

    res = AMQP_STATUS_BAD_AMQP_DATA;
    if (!amqp_decode_bytes(encoded, offset, &entries[num_entries].key, keylen)) {
      goto out;
    }

    res = amqp_decode_field_value(encoded, pool, &entries[num_entries].value,
                                  offset);
    if (res < 0) {
      goto out;
    }

    num_entries++;
  }

  output->num_entries = num_entries;
  output->entries = amqp_pool_alloc(pool, num_entries * sizeof(amqp_table_entry_t));
  res = AMQP_STATUS_NO_MEMORY;
  /* NULL is legitimate if we requested a zero-length block. */
  if (output->entries == NULL && num_entries > 0) {
    goto out;
  }

  memcpy(output->entries, entries, num_entries * sizeof(amqp_table_entry_t));
  res = AMQP_STATUS_OK;

out:
  free(entries);
  return res;
}